

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdD3D6CombineControl::is_valid_val(MthdD3D6CombineControl *this)

{
  MthdD3D6CombineControl *this_local;
  
  if (((this->super_SingleMthdTest).super_MthdTest.val & 0xe0e0e0) == 0) {
    if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3b) >> 0x3d == 0) {
      this_local._7_1_ = false;
    }
    else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x33) >> 0x3d == 0) {
      this_local._7_1_ = false;
    }
    else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2b) >> 0x3d == 0) {
      this_local._7_1_ = false;
    }
    else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x23) >> 0x3d == 0) {
      this_local._7_1_ = false;
    }
    else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x3d == 0) {
      this_local._7_1_ = false;
    }
    else {
      if (this->which != 0) {
        if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3b) >> 0x3d == 7) {
          return false;
        }
        if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x33) >> 0x3d == 7) {
          return false;
        }
        if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2b) >> 0x3d == 7) {
          return false;
        }
        if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x23) >> 0x3d == 7) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (val & 0x00e0e0e0)
			return false;
		if (!extr(val, 2, 3))
			return false;
		if (!extr(val, 10, 3))
			return false;
		if (!extr(val, 18, 3))
			return false;
		if (!extr(val, 26, 3))
			return false;
		if (!extr(val, 29, 3))
			return false;
		if (which) {
			if (extr(val, 2, 3) == 7)
				return false;
			if (extr(val, 10, 3) == 7)
				return false;
			if (extr(val, 18, 3) == 7)
				return false;
			if (extr(val, 26, 3) == 7)
				return false;
		}
		return true;
	}